

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_NodeStore_delete(UA_NodeStore *ns)

{
  uint uVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_UInt32 i;
  ulong uVar3;
  
  uVar1 = ns->size;
  ppUVar2 = ns->entries;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if ((UA_NodeStoreEntry *)0x1 < ppUVar2[uVar3]) {
      deleteEntry(ppUVar2[uVar3]);
    }
  }
  free(ns->entries);
  free(ns);
  return;
}

Assistant:

void
UA_NodeStore_delete(UA_NodeStore *ns) {
    UA_UInt32 size = ns->size;
    UA_NodeStoreEntry **entries = ns->entries;
    for(UA_UInt32 i = 0; i < size; ++i) {
        if(entries[i] > UA_NODESTORE_TOMBSTONE)
            deleteEntry(entries[i]);
    }
    UA_free(ns->entries);
    UA_free(ns);
}